

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.h
# Opt level: O2

uint16_t eia608_from_basicna(uint16_t bna1,uint16_t bna2)

{
  uint16_t uVar1;
  
  if ((bna2 & 0x6000) == 0 || (bna1 & 0x6000) == 0) {
    return 0;
  }
  uVar1 = eia608_parity_word(bna2 >> 8 | bna1 & 0xff00);
  return uVar1;
}

Assistant:

static inline int eia608_is_basicna(uint16_t cc_data) { return 0x0000 != (0x6000 & cc_data); /*&& 0x1F00 < (0x7F00 & cc_data);*/ }